

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::anon_unknown_160::CompositePayloadRec
               (uint32_t depth,AssetResolutionResolver *resolver,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_search_paths,Layer *in_layer,PrimSpec *primspec,string *warn,string *err,
               PayloadCompositionOptions *options)

{
  Path *pPVar1;
  Layer *pLVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  PrimSpec *args;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *pPVar9;
  PrimSpec *extraout_RDX_02;
  string *psVar10;
  long lVar11;
  Payload *pl;
  string *psVar12;
  char *pcVar13;
  PrimSpec *err_00;
  int iVar14;
  PrimSpec *child;
  Layer *pLVar15;
  PayloadCompositionOptions *in_stack_ffffffffffffe750;
  string local_18a0;
  PrimSpec *src_ps;
  Layer *local_1878;
  long *local_1870 [2];
  long local_1860 [2];
  PrimSpec *local_1850;
  string *local_1848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1840;
  Layer *local_1838;
  string asset_path;
  string cwp;
  undefined1 local_17d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  ostringstream ss_e_1;
  _Rb_tree_node_base local_1790 [3];
  ios_base local_1730 [264];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [56];
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  local_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  void *pvStack_38;
  
  local_1838 = (Layer *)asset_search_paths;
  if (*(uint *)&(err->_M_dataplus)._M_p < depth) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x30c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,_ss_e_1);
      if ((_Rb_tree_node_base *)_ss_e_1 != local_1790) {
        operator_delete((void *)_ss_e_1,local_1790[0]._0_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
    return false;
  }
  pLVar15 = (Layer *)(in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
  pLVar2 = (Layer *)(in_layer->_prim_specs)._M_h._M_single_bucket;
  err_00 = primspec;
  local_1878 = in_layer;
  if (pLVar15 != pLVar2) {
    do {
      err_00 = primspec;
      bVar4 = CompositePayloadRec(depth + 1,resolver,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1838,pLVar15,primspec,warn,err,in_stack_ffffffffffffe750)
      ;
      if (!bVar4) {
        return false;
      }
      pLVar15 = (Layer *)((long)&(pLVar15->_metas).timeCodesPerSecond._metas.customData.contained +
                         0x18);
    } while (pLVar15 != pLVar2);
  }
  pLVar15 = local_1878;
  cwp._M_dataplus._M_p = (pointer)&cwp.field_2;
  lVar11 = *(long *)((long)&(local_1878->_metas).timeCodesPerSecond._metas.comment.contained + 0x18)
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&cwp,lVar11,
             *(long *)((long)&(local_1878->_metas).timeCodesPerSecond._metas.comment.contained +
                      0x20) + lVar11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&search_paths,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(pLVar15->_metas).timeCodesPerSecond._metas.customData.contained);
  if (*(char *)((long)&(pLVar15->_metas).metersPerUnit._metas.customData.contained + 8) != '\x01')
  goto switchD_001a83c9_default;
  switch(*(undefined4 *)
          ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x10)) {
  case 0:
  case 4:
    psVar12 = *(string **)
               ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x18);
    local_1848 = *(string **)
                  ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x20);
    if (psVar12 != local_1848) {
      local_1840 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &err->_M_string_length;
      psVar7 = &(local_1878->_name)._M_string_length;
      local_1850 = primspec;
      do {
        asset_path._M_dataplus._M_p = (pointer)&asset_path.field_2;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&asset_path,pcVar3,pcVar3 + psVar12->_M_string_length);
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar8;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pPVar1 = (Path *)(psVar12 + 2);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((AssetPath *)psVar12->_M_string_length == (AssetPath *)0x0) {
          if ((psVar12[2]._M_string_length != 0) && (*(pPVar1->_prim_part)._M_dataplus._M_p == '/'))
          {
            bVar4 = Layer::find_primspec_at(local_1838,pPVar1,&src_ps,warn);
            iVar14 = 1;
            pPVar9 = extraout_RDX_00;
            if (bVar4) goto LAB_001a8590;
            goto LAB_001a8a55;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x333);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          local_1870[0] = local_1860;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1870,"primPath is not absolute path: {}","");
          Path::full_path_name_abi_cxx11_((string *)local_17d8,pPVar1);
          fmt::format<std::__cxx11::string>
                    (&local_18a0,(fmt *)local_1870,(string *)local_17d8,pbVar8);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                              local_18a0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
            operator_delete(local_18a0._M_dataplus._M_p,local_18a0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((pointer)local_17d8._0_8_ != (pointer)(local_17d8 + 0x10)) {
            operator_delete((void *)local_17d8._0_8_,local_17d8._16_8_ + 1);
          }
          primspec = local_1850;
          if (local_1870[0] != local_1860) {
            operator_delete(local_1870[0],local_1860[0] + 1);
          }
joined_r0x001a88a8:
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_18a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar14 = 1;
        }
        else {
          err_00 = (PrimSpec *)(psVar12->_M_dataplus)._M_p;
          pbVar8 = local_1840;
          bVar4 = LoadAsset((anon_unknown_160 *)resolver,(AssetResolutionResolver *)&cwp,
                            (string *)&search_paths,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1840,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                             *)err_00,(AssetPath *)psVar12->_M_string_length,pPVar1,(Layer *)&ss_e,
                            &src_ps,true,*(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,warn);
          pPVar9 = extraout_RDX;
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x33d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_1870[0] = local_1860;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1870,"Failed to `references` asset `{}`","");
            psVar10 = psVar12;
LAB_001a8983:
            fmt::format<std::__cxx11::string>(&local_18a0,(fmt *)local_1870,psVar10,pbVar8);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                                local_18a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
            primspec = local_1850;
            if (local_1870[0] != local_1860) {
              operator_delete(local_1870[0],local_1860[0] + 1);
              primspec = local_1850;
            }
            goto joined_r0x001a88a8;
          }
LAB_001a8590:
          pLVar15 = local_1878;
          if (src_ps == (PrimSpec *)0x0) {
            iVar14 = 7;
          }
          else {
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)warn;
            bVar4 = InheritPrimSpec((tinyusdz *)local_1878,src_ps,pPVar9,warn,(string *)err_00);
            if (!bVar4) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x349);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_1870[0] = local_1860;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1870,"Failed to reference layer `{}`","");
              psVar10 = (string *)&asset_path;
              goto LAB_001a8983;
            }
            if ((pLVar15->_name).field_2._M_allocated_capacity != 0) {
              iVar5 = ::std::__cxx11::string::compare((char *)psVar7);
              iVar14 = 0;
              if (iVar5 != 0) goto LAB_001a8a55;
            }
            iVar14 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar5 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar14 = 0,
               iVar5 != 0)) {
              ::std::__cxx11::string::_M_assign((string *)psVar7);
            }
          }
        }
LAB_001a8a55:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)asset_path._M_dataplus._M_p != &asset_path.field_2) {
          operator_delete(asset_path._M_dataplus._M_p,asset_path.field_2._M_allocated_capacity + 1);
        }
        if ((iVar14 != 7) && (iVar14 != 0)) goto LAB_001a9569;
        psVar12 = psVar12 + 9;
      } while (psVar12 != local_1848);
    }
  default:
switchD_001a83c9_default:
    pLVar15 = local_1878;
    if (*(char *)((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 8) ==
        '\x01') {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x18));
    }
    *(undefined1 *)((long)&(pLVar15->_metas).metersPerUnit._metas.customData.contained + 8) = 0;
    bVar4 = true;
    goto LAB_001a9591;
  case 1:
    psVar12 = *(string **)
               ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x18);
    psVar10 = *(string **)
               ((long)&(local_1878->_metas).metersPerUnit._metas.customData.contained + 0x20);
    if (psVar12 != psVar10) {
      local_1850 = (PrimSpec *)&err->_M_string_length;
      local_1840 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(local_1878->_name)._M_string_length;
      local_1848 = psVar10;
      do {
        asset_path._M_dataplus._M_p = (pointer)&asset_path.field_2;
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&asset_path,pcVar3,pcVar3 + psVar12->_M_string_length);
        _ss_e = (pointer)&local_1618;
        local_1618._M_local_buf[0] = '\0';
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1608 + 0x30);
        local_1608._8_8_ = 1;
        local_1608._16_8_ = (_Hash_node_base *)0x0;
        local_1608._24_8_ = 0;
        local_1608._32_4_ = 1.0;
        local_1608._40_8_ = 0;
        local_1608._48_8_ = (__node_base_ptr)0x0;
        local_1608._0_8_ = pbVar8;
        LayerMetas::LayerMetas(&local_15d0);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_78._0_1_ = true;
        local_78._1_1_ = true;
        local_78._2_1_ = true;
        local_78._3_1_ = true;
        local_78._4_1_ = true;
        local_78._5_1_ = true;
        local_78._6_1_ = true;
        local_78._7_1_ = true;
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_38 = (void *)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        src_ps = (PrimSpec *)0x0;
        pPVar1 = (Path *)(psVar12 + 2);
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((AssetPath *)psVar12->_M_string_length == (AssetPath *)0x0) {
          if ((psVar12[2]._M_string_length != 0) && (*(pPVar1->_prim_part)._M_dataplus._M_p == '/'))
          {
            bVar4 = Layer::find_primspec_at(local_1838,pPVar1,&src_ps,warn);
            iVar14 = 1;
            pPVar9 = extraout_RDX_02;
            if (bVar4) goto LAB_001a8d71;
            goto LAB_001a9223;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x372);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          local_1870[0] = local_1860;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1870,"primPath is not absolute path: {}","");
          Path::full_path_name_abi_cxx11_((string *)local_17d8,pPVar1);
          fmt::format<std::__cxx11::string>
                    (&local_18a0,(fmt *)local_1870,(string *)local_17d8,pbVar8);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                              local_18a0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
            operator_delete(local_18a0._M_dataplus._M_p,local_18a0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((pointer)local_17d8._0_8_ != (pointer)(local_17d8 + 0x10)) {
            operator_delete((void *)local_17d8._0_8_,local_17d8._16_8_ + 1);
          }
          psVar10 = local_1848;
          if (local_1870[0] != local_1860) {
            operator_delete(local_1870[0],local_1860[0] + 1);
          }
joined_r0x001a9072:
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_18a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
          ::std::ios_base::~ios_base(local_1730);
          iVar14 = 1;
        }
        else {
          err_00 = (PrimSpec *)(psVar12->_M_dataplus)._M_p;
          args = local_1850;
          bVar4 = LoadAsset((anon_unknown_160 *)resolver,(AssetResolutionResolver *)&cwp,
                            (string *)&search_paths,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1850,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                             *)err_00,(AssetPath *)psVar12->_M_string_length,pPVar1,(Layer *)&ss_e,
                            &src_ps,true,*(bool *)((long)&(err->_M_dataplus)._M_p + 4),
                            *(bool *)((long)&(err->_M_dataplus)._M_p + 5),(string *)primspec,warn);
          pPVar9 = extraout_RDX_01;
          if (!bVar4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x37c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_1870[0] = local_1860;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1870,"Failed to `references` asset `{}`","");
            psVar10 = psVar12;
LAB_001a914f:
            fmt::format<std::__cxx11::string>
                      (&local_18a0,(fmt *)local_1870,psVar10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e_1,local_18a0._M_dataplus._M_p,
                                local_18a0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_18a0._M_dataplus._M_p != &local_18a0.field_2) {
              operator_delete(local_18a0._M_dataplus._M_p,
                              local_18a0.field_2._M_allocated_capacity + 1);
            }
            psVar10 = local_1848;
            if (local_1870[0] != local_1860) {
              operator_delete(local_1870[0],local_1860[0] + 1);
              psVar10 = local_1848;
            }
            goto joined_r0x001a9072;
          }
LAB_001a8d71:
          pLVar15 = local_1878;
          if (src_ps == (PrimSpec *)0x0) {
            iVar14 = 0x17;
          }
          else {
            args = (PrimSpec *)warn;
            bVar4 = OverridePrimSpec((tinyusdz *)local_1878,src_ps,pPVar9,warn,(string *)err_00);
            if (!bVar4) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss_e_1,"CompositePayloadRec",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e_1,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e_1,0x388);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_1870[0] = local_1860;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1870,"Failed to reference layer `{}`","");
              psVar10 = (string *)&asset_path;
              goto LAB_001a914f;
            }
            if ((pLVar15->_name).field_2._M_allocated_capacity != 0) {
              iVar5 = ::std::__cxx11::string::compare((char *)local_1840);
              iVar14 = 0;
              if (iVar5 != 0) goto LAB_001a9223;
            }
            iVar14 = 0;
            if (((src_ps->_typeName)._M_string_length != 0) &&
               (iVar5 = ::std::__cxx11::string::compare((char *)&src_ps->_typeName), iVar14 = 0,
               iVar5 != 0)) {
              ::std::__cxx11::string::_M_assign((string *)local_1840);
            }
          }
        }
LAB_001a9223:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,
                          CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) +
                          1);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        LayerMetas::~LayerMetas(&local_15d0);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1608);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss_e != &local_1618) {
          operator_delete(_ss_e,CONCAT71(local_1618._M_allocated_capacity._1_7_,
                                         local_1618._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)asset_path._M_dataplus._M_p != &asset_path.field_2) {
          operator_delete(asset_path._M_dataplus._M_p,asset_path.field_2._M_allocated_capacity + 1);
        }
        if ((iVar14 != 0x17) && (iVar14 != 0)) goto LAB_001a9569;
        psVar12 = psVar12 + 9;
      } while (psVar12 != psVar10);
    }
    goto switchD_001a83c9_default;
  case 2:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar13 = "`add` references are not supported yet.";
    lVar11 = 0x27;
    break;
  case 3:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x359);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar13 = "`delete` references are not supported yet.";
    lVar11 = 0x2a;
    break;
  case 5:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar13 = "`order` references are not supported yet.";
    lVar11 = 0x29;
    break;
  case 6:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss_e,"CompositePayloadRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x35f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar13 = "Invalid listedit qualifier to for `references`.";
    lVar11 = 0x2f;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,pcVar13,lVar11);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
  if (warn != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)warn,_ss_e_1);
    if ((_Rb_tree_node_base *)_ss_e_1 != local_1790) {
      operator_delete((void *)_ss_e_1,local_1790[0]._0_8_ + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  ::std::ios_base::~ios_base((ios_base *)&local_15d0.upAxis._metas.comment);
LAB_001a9565:
  bVar4 = false;
LAB_001a9591:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&search_paths);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cwp._M_dataplus._M_p != &cwp.field_2) {
    operator_delete(cwp._M_dataplus._M_p,cwp.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
LAB_001a9569:
  if (iVar14 == 0) goto switchD_001a83c9_default;
  goto LAB_001a9565;
}

Assistant:

bool CompositePayloadRec(uint32_t depth, AssetResolutionResolver &resolver,
                         const std::vector<std::string> &asset_search_paths,
                         const Layer &in_layer,
                         PrimSpec &primspec /* [inout] */, std::string *warn,
                         std::string *err,
                         const PayloadCompositionOptions &options) {
  if (depth > options.max_depth) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositePayloadRec(depth + 1, resolver, asset_search_paths, in_layer, child,
                             warn, err, options)) {
      return false;
    }
  }

  // Use PrimSpec's AssetResolution state.
  std::string cwp = primspec.get_current_working_path();
  std::vector<std::string> search_paths = primspec.get_asset_search_paths();

  if (primspec.metas().payload) {
    const ListEditQual &qual = primspec.metas().payload.value().first;
    const auto &payloads = primspec.metas().payload.value().second;

    if ((qual == ListEditQual::ResetToExplicit) ||
        (qual == ListEditQual::Prepend)) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();
        DCOUT("asset_path = " << asset_path);

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `inherits` op
        if (!InheritPrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }

        DCOUT("inherit done: primspec = " << primspec.name());
      }

    } else if (qual == ListEditQual::Delete) {
      PUSH_ERROR_AND_RETURN("`delete` references are not supported yet.");
    } else if (qual == ListEditQual::Add) {
      PUSH_ERROR_AND_RETURN("`add` references are not supported yet.");
    } else if (qual == ListEditQual::Order) {
      PUSH_ERROR_AND_RETURN("`order` references are not supported yet.");
    } else if (qual == ListEditQual::Invalid) {
      PUSH_ERROR_AND_RETURN("Invalid listedit qualifier to for `references`.");
    } else if (qual == ListEditQual::Append) {
      for (const auto &pl : payloads) {
        std::string asset_path = pl.asset_path.GetAssetPath();

        Layer layer;
        const PrimSpec *src_ps{nullptr};

        if (pl.asset_path.GetAssetPath().empty()) {
          if (pl.prim_path.is_absolute_path()) {
            // Inherit-like operation.

            if (!in_layer.find_primspec_at(pl.prim_path, &src_ps, err)) {
              return false;
            }

          } else {
            PUSH_ERROR_AND_RETURN(
                fmt::format("primPath is not absolute path: {}",
                            pl.prim_path.full_path_name()));
          }
        } else {

          if (!LoadAsset(resolver, cwp, search_paths, options.fileformats,
                         pl.asset_path, pl.prim_path, &layer, &src_ps,
                         /* error_when_no_prims_found */ true,
                         options.error_when_asset_not_found,
                         options.error_when_unsupported_fileformat, warn, err)) {
            PUSH_ERROR_AND_RETURN(fmt::format("Failed to `references` asset `{}`",
                                              pl.asset_path.GetAssetPath()));
          }
        }

        if (!src_ps) {
          // LoadAsset allowed not-found or unsupported file. so do nothing.
          continue;
        }

        // `over` op
        if (!OverridePrimSpec(primspec, *src_ps, warn, err)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("Failed to reference layer `{}`", asset_path));
        }

        // Modify Prim type if this PrimSpec is Model type.
        if (primspec.typeName().empty() || primspec.typeName() == "Model") {
          if (src_ps->typeName().empty() || src_ps->typeName() == "Model") {
            // pass
          } else {
            primspec.typeName() = src_ps->typeName();
          }
        }
      }
    }

  }

  // Remove `payload`.
  primspec.metas().payload.reset();

  return true;
}